

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O1

S2CellUnion * __thiscall
S2CellUnion::Difference(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellUnion *y)

{
  pointer pSVar1;
  bool bVar2;
  pointer pSVar3;
  S2CellUnion *__range1;
  S2LogMessage local_40;
  
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_002c1838
  ;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    GetDifferenceInternal((S2CellId)pSVar3->id_,y,&__return_storage_ptr__->cell_ids_);
  }
  bVar2 = IsNormalized(__return_storage_ptr__);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = IsNormalized(this);
  }
  if (bVar2 != false) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
               ,400,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: result.IsNormalized() || !IsNormalized() ",0x37);
    if (bVar2 != false) {
      abort();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Difference(const S2CellUnion& y) const {
  // TODO(ericv): this is approximately O(N*log(N)), but could probably
  // use similar techniques as GetIntersection() to be more efficient.

  S2CellUnion result;
  for (S2CellId id : *this) {
    GetDifferenceInternal(id, y, &result.cell_ids_);
  }
  // The output is normalized as long as the first argument is normalized.
  S2_DCHECK(result.IsNormalized() || !IsNormalized());
  return result;
}